

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  char *pcVar4;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject;
  
  MyTypeForTesting::MyTypeForTesting(&actualObject,0xa53b5);
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_50,&copier);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"someFunc");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_30,"MyTypeForTesting");
  SimpleString::SimpleString(&local_40,"someParameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar1),&local_30,&local_40,&actualObject);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  pcVar4 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Function name:someFunc MyTypeForTesting someParameter:",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x1bb);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  MyTypeForTesting::~MyTypeForTesting(&actualObject);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterTraced)
{
    MyTypeForTesting actualObject(676789);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);
    mock().tracing(true);

    mock().actualCall("someFunc").withOutputParameterOfType("MyTypeForTesting", "someParameter", &actualObject);

    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc MyTypeForTesting someParameter:", mock().getTraceOutput());

    mock().removeAllComparatorsAndCopiers();
}